

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O1

void llvm::APInt::divide(WordType *LHS,uint lhsWords,WordType *RHS,uint rhsWords,WordType *Quotient,
                        WordType *Remainder)

{
  undefined8 uVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  uint *__s;
  uint *__s_00;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  byte bVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  byte bVar13;
  uint uVar14;
  int iVar15;
  long lVar16;
  long lVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  ulong uVar21;
  ulong uVar22;
  int iVar23;
  uint32_t SPACE [128];
  uint *local_288;
  uint *local_278;
  uint local_238 [130];
  
  if (lhsWords < rhsWords) {
    __assert_fail("lhsWords >= rhsWords && \"Fractional result\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                  ,0x581,
                  "static void llvm::APInt::divide(const WordType *, unsigned int, const WordType *, unsigned int, WordType *, WordType *)"
                 );
  }
  uVar4 = rhsWords * 2;
  uVar21 = (ulong)uVar4;
  uVar19 = lhsWords * 2;
  uVar14 = uVar19 + rhsWords * -2;
  uVar7 = (ulong)uVar14;
  uVar18 = lhsWords * 2 + 1;
  uVar5 = (ulong)uVar19;
  if ((4 - (uint)(Remainder == (WordType *)0x0)) * uVar4 + uVar14 * 2 + 1 < 0x81) {
    __s_00 = local_238 + uVar18;
    local_278 = local_238 + (uVar4 + uVar18);
    __s = local_238;
    if (Remainder == (WordType *)0x0) {
      local_288 = (uint *)0x0;
    }
    else {
      local_288 = local_238 + (uVar4 + uVar18 + uVar19);
    }
  }
  else {
    __s = (uint *)operator_new__((ulong)uVar18 << 2);
    __s_00 = (uint *)operator_new__(uVar21 * 4);
    local_278 = (uint *)operator_new__(uVar5 * 4);
    if (Remainder == (WordType *)0x0) {
      local_288 = (uint *)0x0;
    }
    else {
      local_288 = (uint *)operator_new__(uVar21 * 4);
    }
  }
  memset(__s,0,uVar5 * 4 + 4);
  if (lhsWords != 0) {
    uVar11 = 0;
    do {
      uVar1 = *(undefined8 *)((long)LHS + uVar11 * 4);
      __s[uVar11 & 0xffffffff] = (uint)uVar1;
      __s[(int)uVar11 + 1] = (uint)((ulong)uVar1 >> 0x20);
      uVar11 = uVar11 + 2;
    } while ((ulong)lhsWords * 2 != uVar11);
  }
  __s[uVar5] = 0;
  memset(__s_00,0,uVar21 * 4);
  if (rhsWords != 0) {
    uVar11 = 0;
    do {
      uVar1 = *(undefined8 *)((long)RHS + uVar11 * 4);
      __s_00[uVar11 & 0xffffffff] = (uint)uVar1;
      __s_00[(int)uVar11 + 1] = (uint)((ulong)uVar1 >> 0x20);
      uVar11 = uVar11 + 2;
    } while ((ulong)rhsWords * 2 != uVar11);
  }
  memset(local_278,0,uVar5 << 2);
  if (Remainder != (WordType *)0x0) {
    memset(local_288,0,uVar21 * 4);
  }
  if (uVar4 != 0) {
    do {
      if (__s_00[uVar21 - 1] != 0) {
        uVar7 = (ulong)(uVar19 - (int)uVar21);
        uVar21 = uVar21 & 0xffffffff;
        goto LAB_0017e06e;
      }
      uVar21 = uVar21 - 1;
    } while (uVar21 != 0);
    uVar21 = 0;
    uVar7 = (ulong)uVar19;
  }
LAB_0017e06e:
  iVar23 = (int)uVar21;
  uVar4 = iVar23 + (int)uVar7;
  if (uVar4 != 0) {
    uVar5 = (ulong)uVar4;
    do {
      if (__s[uVar5 - 1] != 0) goto LAB_0017e099;
      uVar7 = (ulong)((int)uVar7 - 1);
      uVar5 = uVar5 - 1;
    } while (uVar5 != 0);
    uVar7 = (ulong)(uint)-iVar23;
  }
LAB_0017e099:
  iVar15 = (int)uVar7;
  if (iVar23 == 1) {
    if (iVar15 < 0) {
      uVar4 = 0;
    }
    else {
      uVar19 = *__s_00;
      uVar5 = (ulong)uVar19;
      lVar17 = uVar7 + 1;
      uVar7 = 0;
      do {
        uVar4 = __s[lVar17 + -1];
        uVar21 = (ulong)uVar4;
        uVar7 = uVar7 << 0x20 | uVar21;
        if (uVar7 == 0) {
          local_278[lVar17 + -1] = 0;
LAB_0017e124:
          uVar21 = 0;
        }
        else if (uVar7 < uVar5) {
          local_278[lVar17 + -1] = 0;
        }
        else {
          if (uVar7 == uVar5) {
            local_278[lVar17 + -1] = 1;
            goto LAB_0017e124;
          }
          uVar14 = (uint)(uVar7 / uVar5);
          local_278[lVar17 + -1] = uVar14;
          uVar21 = (ulong)(uVar4 - uVar14 * uVar19);
        }
        uVar4 = (uint)uVar21;
        lVar16 = lVar17 + -1;
        bVar2 = 0 < lVar17;
        lVar17 = lVar16;
        uVar7 = uVar21;
      } while (lVar16 != 0 && bVar2);
    }
    if (local_288 != (uint *)0x0) {
      *local_288 = uVar4;
    }
  }
  else {
    if (iVar23 == 0) {
      __assert_fail("n != 0 && \"Divide by zero?\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                    ,0x5c9,
                    "static void llvm::APInt::divide(const WordType *, unsigned int, const WordType *, unsigned int, WordType *, WordType *)"
                   );
    }
    if (((__s_00 == local_278) || (__s == __s_00)) || (__s == local_278)) {
      __assert_fail("u != v && u != q && v != q && \"Must use different memory\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                    ,0x4e0,
                    "void KnuthDiv(uint32_t *, uint32_t *, uint32_t *, uint32_t *, unsigned int, unsigned int)"
                   );
    }
    uVar19 = iVar23 - 1;
    uVar7 = (ulong)uVar19;
    uVar4 = __s_00[uVar7];
    if (uVar4 == 0) {
      uVar14 = 0x20;
    }
    else {
      uVar14 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> uVar14 == 0; uVar14 = uVar14 - 1) {
        }
      }
      uVar14 = uVar14 ^ 0x1f;
    }
    bVar8 = (byte)uVar14;
    if (uVar14 == 0) {
      uVar4 = 0;
    }
    else {
      if (iVar15 + iVar23 == 0) {
        uVar4 = 0;
      }
      else {
        uVar5 = 0;
        uVar18 = 0;
        do {
          uVar4 = __s[uVar5] >> (0x20 - bVar8 & 0x1f);
          __s[uVar5] = __s[uVar5] << (bVar8 & 0x1f) | uVar18;
          uVar5 = uVar5 + 1;
          uVar18 = uVar4;
        } while ((uint)(iVar15 + iVar23) != uVar5);
      }
      if (iVar23 != 0) {
        uVar5 = 0;
        uVar18 = 0;
        do {
          uVar9 = __s_00[uVar5];
          __s_00[uVar5] = uVar9 << (bVar8 & 0x1f) | uVar18;
          uVar5 = uVar5 + 1;
          uVar18 = uVar9 >> (0x20 - bVar8 & 0x1f);
        } while (uVar21 != uVar5);
      }
    }
    __s[(uint)(iVar23 + iVar15)] = uVar4;
    lVar17 = (long)iVar15;
    do {
      iVar15 = (int)lVar17;
      uVar4 = iVar23 + iVar15;
      uVar22 = (ulong)__s_00[uVar7];
      uVar5 = CONCAT44(__s[uVar4],__s[(iVar23 + iVar15) - 1]) / uVar22;
      uVar11 = CONCAT44(__s[uVar4],__s[(iVar23 + iVar15) - 1]) % uVar22;
      if ((uVar5 == 0x100000000) ||
         (uVar12 = (ulong)__s[uVar4 - 2] | uVar11 << 0x20, uVar6 = uVar5,
         uVar12 <= __s_00[iVar23 - 2U] * uVar5 && __s_00[iVar23 - 2U] * uVar5 - uVar12 != 0)) {
        uVar6 = uVar5 - 1;
        uVar11 = uVar11 + uVar22;
        if ((uVar11 >> 0x20 == 0) &&
           ((uVar6 == 0x100000000 ||
            (uVar11 = (ulong)__s[uVar4 - 2] | uVar11 << 0x20,
            uVar11 <= __s_00[iVar23 - 2U] * uVar6 && __s_00[iVar23 - 2U] * uVar6 - uVar11 != 0)))) {
          uVar6 = uVar5 - 2;
        }
      }
      if (iVar23 == 0) {
        uVar5 = 0;
      }
      else {
        uVar11 = 0;
        uVar5 = 0;
        do {
          uVar18 = __s_00[uVar11];
          uVar9 = iVar15 + (int)uVar11;
          lVar16 = (ulong)__s[uVar9] - ((uVar18 * uVar6 & 0xffffffff) + uVar5);
          __s[uVar9] = (uint)lVar16;
          uVar5 = (ulong)(uint)((int)(uVar18 * uVar6 >> 0x20) - (int)((ulong)lVar16 >> 0x20));
          uVar11 = uVar11 + 1;
        } while (uVar21 != uVar11);
      }
      uVar18 = __s[uVar4];
      __s[uVar4] = uVar18 - (int)uVar5;
      local_278[lVar17] = (uint)uVar6;
      if (uVar18 < uVar5) {
        local_278[lVar17] = (uint)uVar6 - 1;
        if (iVar23 == 0) {
          uVar18 = 0;
        }
        else {
          uVar5 = 0;
          uVar18 = 0;
          do {
            uVar10 = iVar15 + (int)uVar5;
            uVar9 = __s_00[uVar5];
            uVar20 = __s[uVar10];
            uVar3 = uVar20;
            if (uVar9 < uVar20) {
              uVar3 = uVar9;
            }
            bVar13 = (byte)uVar18;
            uVar20 = uVar18 + uVar9 + uVar20;
            __s[uVar10] = uVar20;
            uVar18 = 1;
            if (uVar3 <= uVar20) {
              uVar18 = (uint)(bVar13 & uVar20 == uVar3);
            }
            uVar5 = uVar5 + 1;
          } while (uVar21 != uVar5);
        }
        __s[uVar4] = __s[uVar4] + uVar18;
      }
      bVar2 = 0 < lVar17;
      lVar17 = lVar17 + -1;
    } while (bVar2);
    if (local_288 != (uint *)0x0) {
      if (uVar14 == 0) {
        if (-1 < (int)uVar19) {
          lVar17 = uVar7 + 1;
          do {
            local_288[lVar17 + -1] = __s[lVar17 + -1];
            lVar16 = lVar17 + -1;
            bVar2 = 0 < lVar17;
            lVar17 = lVar16;
          } while (lVar16 != 0 && bVar2);
        }
      }
      else if (-1 < (int)uVar19) {
        lVar17 = uVar7 + 1;
        uVar4 = 0;
        do {
          uVar19 = __s[lVar17 + -1];
          local_288[lVar17 + -1] = uVar19 >> (bVar8 & 0x1f) | uVar4;
          lVar16 = lVar17 + -1;
          bVar2 = 0 < lVar17;
          lVar17 = lVar16;
          uVar4 = uVar19 << (0x20 - bVar8 & 0x1f);
        } while (lVar16 != 0 && bVar2);
      }
    }
  }
  if (lhsWords != 0 && Quotient != (WordType *)0x0) {
    uVar7 = 0;
    do {
      *(ulong *)((long)Quotient + uVar7 * 4) =
           CONCAT44(local_278[(int)uVar7 + 1],local_278[uVar7 & 0xffffffff]);
      uVar7 = uVar7 + 2;
    } while ((ulong)lhsWords * 2 != uVar7);
  }
  if (rhsWords != 0 && Remainder != (WordType *)0x0) {
    uVar7 = 0;
    do {
      *(ulong *)((long)Remainder + uVar7 * 4) =
           CONCAT44(local_288[(int)uVar7 + 1],local_288[uVar7 & 0xffffffff]);
      uVar7 = uVar7 + 2;
    } while ((ulong)rhsWords * 2 != uVar7);
  }
  if (__s != local_238) {
    operator_delete__(__s);
    operator_delete__(__s_00);
    operator_delete__(local_278);
    if (local_288 != (uint *)0x0) {
      operator_delete__(local_288);
    }
  }
  return;
}

Assistant:

void APInt::divide(const WordType *LHS, unsigned lhsWords, const WordType *RHS,
                   unsigned rhsWords, WordType *Quotient, WordType *Remainder) {
  assert(lhsWords >= rhsWords && "Fractional result");

  // First, compose the values into an array of 32-bit words instead of
  // 64-bit words. This is a necessity of both the "short division" algorithm
  // and the Knuth "classical algorithm" which requires there to be native
  // operations for +, -, and * on an m bit value with an m*2 bit result. We
  // can't use 64-bit operands here because we don't have native results of
  // 128-bits. Furthermore, casting the 64-bit values to 32-bit values won't
  // work on large-endian machines.
  unsigned n = rhsWords * 2;
  unsigned m = (lhsWords * 2) - n;

  // Allocate space for the temporary values we need either on the stack, if
  // it will fit, or on the heap if it won't.
  uint32_t SPACE[128];
  uint32_t *U = nullptr;
  uint32_t *V = nullptr;
  uint32_t *Q = nullptr;
  uint32_t *R = nullptr;
  if ((Remainder?4:3)*n+2*m+1 <= 128) {
    U = &SPACE[0];
    V = &SPACE[m+n+1];
    Q = &SPACE[(m+n+1) + n];
    if (Remainder)
      R = &SPACE[(m+n+1) + n + (m+n)];
  } else {
    U = new uint32_t[m + n + 1];
    V = new uint32_t[n];
    Q = new uint32_t[m+n];
    if (Remainder)
      R = new uint32_t[n];
  }

  // Initialize the dividend
  memset(U, 0, (m+n+1)*sizeof(uint32_t));
  for (unsigned i = 0; i < lhsWords; ++i) {
    uint64_t tmp = LHS[i];
    U[i * 2] = Lo_32(tmp);
    U[i * 2 + 1] = Hi_32(tmp);
  }
  U[m+n] = 0; // this extra word is for "spill" in the Knuth algorithm.

  // Initialize the divisor
  memset(V, 0, (n)*sizeof(uint32_t));
  for (unsigned i = 0; i < rhsWords; ++i) {
    uint64_t tmp = RHS[i];
    V[i * 2] = Lo_32(tmp);
    V[i * 2 + 1] = Hi_32(tmp);
  }

  // initialize the quotient and remainder
  memset(Q, 0, (m+n) * sizeof(uint32_t));
  if (Remainder)
    memset(R, 0, n * sizeof(uint32_t));

  // Now, adjust m and n for the Knuth division. n is the number of words in
  // the divisor. m is the number of words by which the dividend exceeds the
  // divisor (i.e. m+n is the length of the dividend). These sizes must not
  // contain any zero words or the Knuth algorithm fails.
  for (unsigned i = n; i > 0 && V[i-1] == 0; i--) {
    n--;
    m++;
  }
  for (unsigned i = m+n; i > 0 && U[i-1] == 0; i--)
    m--;

  // If we're left with only a single word for the divisor, Knuth doesn't work
  // so we implement the short division algorithm here. This is much simpler
  // and faster because we are certain that we can divide a 64-bit quantity
  // by a 32-bit quantity at hardware speed and short division is simply a
  // series of such operations. This is just like doing short division but we
  // are using base 2^32 instead of base 10.
  assert(n != 0 && "Divide by zero?");
  if (n == 1) {
    uint32_t divisor = V[0];
    uint32_t remainder = 0;
    for (int i = m; i >= 0; i--) {
      uint64_t partial_dividend = Make_64(remainder, U[i]);
      if (partial_dividend == 0) {
        Q[i] = 0;
        remainder = 0;
      } else if (partial_dividend < divisor) {
        Q[i] = 0;
        remainder = Lo_32(partial_dividend);
      } else if (partial_dividend == divisor) {
        Q[i] = 1;
        remainder = 0;
      } else {
        Q[i] = Lo_32(partial_dividend / divisor);
        remainder = Lo_32(partial_dividend - (Q[i] * divisor));
      }
    }
    if (R)
      R[0] = remainder;
  } else {
    // Now we're ready to invoke the Knuth classical divide algorithm. In this
    // case n > 1.
    KnuthDiv(U, V, Q, R, m, n);
  }

  // If the caller wants the quotient
  if (Quotient) {
    for (unsigned i = 0; i < lhsWords; ++i)
      Quotient[i] = Make_64(Q[i*2+1], Q[i*2]);
  }

  // If the caller wants the remainder
  if (Remainder) {
    for (unsigned i = 0; i < rhsWords; ++i)
      Remainder[i] = Make_64(R[i*2+1], R[i*2]);
  }

  // Clean up the memory we allocated.
  if (U != &SPACE[0]) {
    delete [] U;
    delete [] V;
    delete [] Q;
    delete [] R;
  }
}